

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_send_digest_auth_request(mg_connection *c)

{
  undefined8 uVar1;
  time_t tVar2;
  
  c->status_code = 0x191;
  uVar1 = *(undefined8 *)(c[1].request_method + 0x48);
  tVar2 = time((time_t *)0x0);
  mg_printf(c,
            "HTTP/1.1 401 Unauthorized\r\nWWW-Authenticate: Digest qop=\"auth\", realm=\"%s\", nonce=\"%lu\"\r\n\r\n"
            ,uVar1,tVar2);
  close_local_endpoint((connection *)&c[-1].callback_param);
  return;
}

Assistant:

void mg_send_digest_auth_request(struct mg_connection *c) {
  struct connection *conn = MG_CONN_2_CONN(c);
  c->status_code = 401;
  mg_printf(c,
            "HTTP/1.1 401 Unauthorized\r\n"
            "WWW-Authenticate: Digest qop=\"auth\", "
            "realm=\"%s\", nonce=\"%lu\"\r\n\r\n",
            conn->server->config_options[AUTH_DOMAIN],
            (unsigned long) time(NULL));
  close_local_endpoint(conn);
}